

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

void __thiscall bssl::Vector<TagAndArray>::clear(Vector<TagAndArray> *this)

{
  TagAndArray *pTVar1;
  size_t sVar2;
  bool bVar3;
  
  pTVar1 = this->data_;
  sVar2 = this->size_;
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    Vector<unsigned_long>::~Vector(&pTVar1->vec);
    pTVar1 = (TagAndArray *)(&pTVar1->vec + 1);
  }
  OPENSSL_free(this->data_);
  this->data_ = (TagAndArray *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

void clear() {
    std::destroy_n(data_, size_);
    OPENSSL_free(data_);
    data_ = nullptr;
    size_ = 0;
    capacity_ = 0;
  }